

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O1

int LS_Thing_Hate(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,int arg4)

{
  AActor **ppAVar1;
  AActor *pAVar2;
  AActor *pAVar3;
  AActor *pAVar4;
  AActor *this;
  AActor *pAVar5;
  AActor *pAVar6;
  bool bVar7;
  
  if (arg1 == 0) {
    pAVar5 = (AActor *)0x0;
    bVar7 = false;
    pAVar3 = (AActor *)0x0;
  }
  else {
    pAVar5 = (AActor *)0x0;
    do {
      ppAVar1 = &pAVar5->inext;
      if (pAVar5 == (AActor *)0x0) {
        ppAVar1 = (AActor **)((long)AActor::TIDHash + (ulong)((arg1 & 0x7fU) << 3));
      }
      for (pAVar5 = *ppAVar1; (pAVar5 != (AActor *)0x0 && (pAVar5->tid != arg1));
          pAVar5 = pAVar5->inext) {
      }
      bVar7 = pAVar5 == (AActor *)0x0;
      if (bVar7) {
        pAVar3 = (AActor *)0x0;
        break;
      }
    } while (((((pAVar5->flags).Value & 4) == 0) || (pAVar5->health < 1)) ||
            (pAVar3 = pAVar5, ((pAVar5->flags2).Value & 0x10000000) != 0));
  }
  if (arg0 == 0) {
    if ((it != (AActor *)0x0) && (it->player != (player_t *)0x0)) {
      return 0;
    }
    pAVar6 = (AActor *)0x0;
    this = it;
  }
  else {
    pAVar6 = (AActor *)0x0;
    do {
      ppAVar1 = &pAVar6->inext;
      if (pAVar6 == (AActor *)0x0) {
        ppAVar1 = (AActor **)((long)AActor::TIDHash + (ulong)((arg0 & 0x7fU) << 3));
      }
      for (pAVar6 = *ppAVar1; (pAVar6 != (AActor *)0x0 && (pAVar6->tid != arg0));
          pAVar6 = pAVar6->inext) {
      }
      if (pAVar6 == (AActor *)0x0) {
        this = (AActor *)0x0;
        break;
      }
    } while ((pAVar6->health < 1) || (this = pAVar6, ((pAVar6->flags).Value & 4) == 0));
  }
  if (this != (AActor *)0x0) {
    do {
      pAVar4 = pAVar3;
      if (this->SeeState != (FState *)0x0) {
        if (arg2 != 0) {
          this->TIDtoHate = arg1;
          (this->LastLookActor).field_0.p = (AActor *)0x0;
          if (arg1 != 0) {
            pAVar4 = (this->target).field_0.p;
            if ((pAVar4 != (AActor *)0x0) &&
               ((((pAVar4->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0 ||
                (((this->target).field_0.p)->tid != arg1)))) {
              (this->target).field_0.p = (AActor *)0x0;
            }
            pAVar4 = (this->lastenemy).field_0.p;
            if ((pAVar4 != (AActor *)0x0) &&
               ((((pAVar4->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0 ||
                (((this->lastenemy).field_0.p)->tid != arg1)))) {
              (this->lastenemy).field_0.p = (AActor *)0x0;
            }
          }
        }
        if (((uint)arg2 < 7) && ((0x54U >> (arg2 & 0x1fU) & 1) != 0)) {
          *(byte *)&(this->flags3).Value = (byte)(this->flags3).Value | 0x80;
        }
        else {
          *(byte *)&(this->flags3).Value = (byte)(this->flags3).Value & 0x7f;
        }
        (this->flags3).Value = (this->flags3).Value & 0x7fffffff | (uint)(arg2 - 3U < 2) << 0x1f;
        (this->flags4).Value = (this->flags4).Value & 0xfffffffe | (uint)(arg2 - 5U < 2);
        pAVar4 = it;
        if (arg1 != 0) {
          if (bVar7) {
            pAVar3 = (AActor *)0x0;
          }
          pAVar4 = pAVar3;
          if (arg2 != 0 && !bVar7) {
            do {
              ppAVar1 = &pAVar5->inext;
              if (pAVar5 == (AActor *)0x0) {
                ppAVar1 = AActor::TIDHash + (arg1 & 0x7f);
              }
              for (pAVar4 = *ppAVar1; (pAVar4 != (AActor *)0x0 && (pAVar4->tid != arg1));
                  pAVar4 = pAVar4->inext) {
              }
              pAVar5 = pAVar4;
            } while ((((pAVar4 == (AActor *)0x0) || (pAVar4 == this)) ||
                     (((pAVar4->flags).Value & 4) == 0)) ||
                    ((pAVar4->health < 1 || (((pAVar4->flags2).Value & 0x10000000) != 0))));
          }
        }
        if (pAVar4 == (AActor *)0x0) {
          pAVar4 = (AActor *)0x0;
        }
        else if (pAVar4 != this) {
          if (arg2 == 0) {
LAB_00508c92:
            pAVar3 = (this->target).field_0.p;
            if (pAVar3 != (AActor *)0x0) {
              if (((pAVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
                (this->lastenemy).field_0 = (this->target).field_0;
              }
              else {
                (this->target).field_0.p = (AActor *)0x0;
              }
            }
            (this->target).field_0.p = pAVar4;
            if ((((this->flags2).Value & 0x10000000) == 0) && (0 < this->health)) {
              AActor::SetState(this,this->SeeState,false);
            }
          }
          else {
            pAVar3 = (this->goal).field_0.p;
            if (pAVar3 != (AActor *)0x0) {
              if (((pAVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
                pAVar3 = (this->goal).field_0.p;
                if ((pAVar3 != (AActor *)0x0) &&
                   (((pAVar3->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
                  (this->goal).field_0.p = (AActor *)0x0;
                  pAVar3 = (AActor *)0x0;
                }
                pAVar2 = (this->target).field_0.p;
                if ((pAVar2 != (AActor *)0x0) &&
                   (((pAVar2->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
                  (this->target).field_0.p = (AActor *)0x0;
                  pAVar2 = (AActor *)0x0;
                }
                if (pAVar2 != pAVar3) goto LAB_00508c92;
              }
              else {
                (this->goal).field_0.p = (AActor *)0x0;
              }
            }
          }
        }
      }
      this = pAVar6;
      if (arg0 == 0) {
LAB_00508d65:
        this = (AActor *)0x0;
      }
      else {
        do {
          ppAVar1 = &this->inext;
          if (this == (AActor *)0x0) {
            ppAVar1 = AActor::TIDHash + (arg0 & 0x7f);
          }
          for (this = *ppAVar1; (this != (AActor *)0x0 && (this->tid != arg0)); this = this->inext)
          {
          }
          pAVar6 = this;
          if (this == (AActor *)0x0) goto LAB_00508d65;
        } while ((this->health < 1) || (((this->flags).Value & 4) == 0));
      }
      pAVar3 = pAVar4;
    } while (this != (AActor *)0x0);
  }
  return 1;
}

Assistant:

FUNC(LS_Thing_Hate)
// Thing_Hate (hater, hatee, group/"xray"?)
{
	FActorIterator haterIt (arg0);
	AActor *hater, *hatee = NULL;
	FActorIterator hateeIt (arg1);
	bool nothingToHate = false;

	if (arg1 != 0)
	{
		while ((hatee = hateeIt.Next ()))
		{
			if (hatee->flags & MF_SHOOTABLE	&&	// can't hate nonshootable things
				hatee->health > 0 &&			// can't hate dead things
				!(hatee->flags2 & MF2_DORMANT))	// can't target dormant things
			{
				break;
			}
		}
		if (hatee == NULL)
		{ // Nothing to hate
			nothingToHate = true;
		}
	}

	if (arg0 == 0)
	{
		if (it != NULL && it->player != NULL)
		{
			// Players cannot have their attitudes set
			return false;
		}
		else
		{
			hater = it;
		}
	}
	else
	{
		while ((hater = haterIt.Next ()))
		{
			if (hater->health > 0 && hater->flags & MF_SHOOTABLE)
			{
				break;
			}
		}
	}
	while (hater != NULL)
	{
		// Can't hate if can't attack.
		if (hater->SeeState != NULL)
		{
			// If hating a group of things, record the TID and NULL
			// the target (if its TID doesn't match). A_Look will
			// find an appropriate thing to go chase after.
			if (arg2 != 0)
			{
				hater->TIDtoHate = arg1;
				hater->LastLookActor = NULL;

				// If the TID to hate is 0, then don't forget the target and
				// lastenemy fields.
				if (arg1 != 0)
				{
					if (hater->target != NULL && hater->target->tid != arg1)
					{
						hater->target = NULL;
					}
					if (hater->lastenemy != NULL && hater->lastenemy->tid != arg1)
					{
						hater->lastenemy = NULL;
					}
				}
			}
			// Hate types for arg2:
			//
			// 0 - Just hate one specific actor
			// 1 - Hate actors with given TID and attack players when shot
			// 2 - Same as 1, but will go after enemies without seeing them first
			// 3 - Hunt actors with given TID and also players
			// 4 - Same as 3, but will go after monsters without seeing them first
			// 5 - Hate actors with given TID and ignore player attacks
			// 6 - Same as 5, but will go after enemies without seeing them first

			// Note here: If you use Thing_Hate (tid, 0, 2), you can make
			// a monster go after a player without seeing him first.
			if (arg2 == 2 || arg2 == 4 || arg2 == 6)
			{
				hater->flags3 |= MF3_NOSIGHTCHECK;
			}
			else
			{
				hater->flags3 &= ~MF3_NOSIGHTCHECK;
			}
			if (arg2 == 3 || arg2 == 4)
			{
				hater->flags3 |= MF3_HUNTPLAYERS;
			}
			else
			{
				hater->flags3 &= ~MF3_HUNTPLAYERS;
			}
			if (arg2 == 5 || arg2 == 6)
			{
				hater->flags4 |= MF4_NOHATEPLAYERS;
			}
			else
			{
				hater->flags4 &= ~MF4_NOHATEPLAYERS;
			}

			if (arg1 == 0)
			{
				hatee = it;
			}
			else if (nothingToHate)
			{
				hatee = NULL;
			}
			else if (arg2 != 0)
			{
				do
				{
					hatee = hateeIt.Next ();
				}
				while ( hatee == NULL ||
						hatee == hater ||					// can't hate self
						!(hatee->flags & MF_SHOOTABLE) ||	// can't hate nonshootable things
						hatee->health <= 0 ||				// can't hate dead things
						(hatee->flags2 & MF2_DORMANT));	
			}

			if (hatee != NULL && hatee != hater && (arg2 == 0 || (hater->goal != NULL && hater->target != hater->goal)))
			{
				if (hater->target)
				{
					hater->lastenemy = hater->target;
				}
				hater->target = hatee;
				if (!(hater->flags2 & MF2_DORMANT))
				{
					if (hater->health > 0) hater->SetState (hater->SeeState);
				}
			}
		}
		if (arg0 != 0)
		{
			while ((hater = haterIt.Next ()))
			{
				if (hater->health > 0 && hater->flags & MF_SHOOTABLE)
				{
					break;
				}
			}
		}
		else
		{
			hater = NULL;
		}
	}
	return true;
}